

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

double __thiscall
ImPlot::PlotHistogram<short>
          (ImPlot *this,char *label_id,short *values,int count,int bins,bool cumulative,bool density
          ,ImPlotRange range,bool outliers,double bar_scale)

{
  short sVar1;
  double *pdVar2;
  ImPlotContext *pIVar3;
  short sVar4;
  int iVar5;
  double *pdVar6;
  short sVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double __x;
  double local_90;
  GetterXsYs<double> local_50;
  
  dVar16 = range.Max;
  dVar17 = range.Min;
  iVar8 = (int)values;
  if (count == 0 || iVar8 < 1) {
    return 0.0;
  }
  if ((((dVar17 == 0.0) && (!NAN(dVar17))) && (dVar16 == 0.0)) && (!NAN(dVar16))) {
    sVar4 = *(short *)label_id;
    sVar7 = sVar4;
    if (1 < iVar8) {
      uVar9 = 1;
      do {
        sVar1 = *(short *)(label_id + uVar9 * 2);
        if (sVar1 < sVar4) {
          sVar4 = sVar1;
        }
        if (sVar1 <= sVar7) {
          sVar1 = sVar7;
        }
        sVar7 = sVar1;
        uVar9 = uVar9 + 1;
      } while (((ulong)values & 0xffffffff) != uVar9);
    }
    dVar17 = (double)(int)sVar4;
    dVar16 = (double)(int)sVar7;
  }
  if (-1 < count) goto switchD_0024229c_default;
  switch(count) {
  case -4:
    __x = (double)iVar8;
    dVar15 = 0.0;
    dVar18 = 0.0;
    if (0 < iVar8) {
      uVar9 = 0;
      do {
        dVar18 = dVar18 + (double)(int)*(short *)(label_id + uVar9 * 2) * (1.0 / __x);
        uVar9 = uVar9 + 1;
      } while (((ulong)values & 0xffffffff) != uVar9);
    }
    if (0 < iVar8) {
      dVar15 = 0.0;
      uVar9 = 0;
      do {
        dVar15 = dVar15 + ((double)(int)*(short *)(label_id + uVar9 * 2) - dVar18) *
                          ((double)(int)*(short *)(label_id + uVar9 * 2) - dVar18) *
                          (1.0 / (__x + -1.0));
        uVar9 = uVar9 + 1;
      } while (((ulong)values & 0xffffffff) != uVar9);
    }
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
    }
    else {
      dVar15 = SQRT(dVar15);
    }
    dVar18 = cbrt(__x);
    dVar15 = round((dVar16 - dVar17) / ((dVar15 * 3.49) / dVar18));
    count = (int)dVar15;
    break;
  case -3:
    dVar15 = cbrt((double)iVar8);
    dVar15 = dVar15 + dVar15;
    goto LAB_0024285f;
  case -2:
    dVar15 = log2((double)iVar8);
    dVar15 = dVar15 + 1.0;
LAB_0024285f:
    dVar15 = ceil(dVar15);
    count = (int)dVar15;
    break;
  case -1:
    dVar15 = (double)iVar8;
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
    }
    else {
      dVar15 = SQRT(dVar15);
    }
    dVar15 = ceil(dVar15);
    count = (int)dVar15;
  }
switchD_0024229c_default:
  pIVar3 = GImPlot;
  iVar5 = (GImPlot->Temp1).Capacity;
  if (iVar5 < count) {
    if (iVar5 == 0) {
      uVar14 = 8;
    }
    else {
      uVar14 = iVar5 / 2 + iVar5;
    }
    if ((int)uVar14 <= count) {
      uVar14 = count;
    }
    if (iVar5 < (int)uVar14) {
      pdVar6 = (double *)ImGui::MemAlloc((long)(int)uVar14 << 3);
      pdVar2 = (pIVar3->Temp1).Data;
      if (pdVar2 != (double *)0x0) {
        memcpy(pdVar6,pdVar2,(long)(pIVar3->Temp1).Size << 3);
        ImGui::MemFree((pIVar3->Temp1).Data);
      }
      (pIVar3->Temp1).Data = pdVar6;
      (pIVar3->Temp1).Capacity = uVar14;
    }
  }
  (pIVar3->Temp1).Size = count;
  iVar5 = (pIVar3->Temp2).Capacity;
  if (iVar5 < count) {
    if (iVar5 == 0) {
      uVar14 = 8;
    }
    else {
      uVar14 = iVar5 / 2 + iVar5;
    }
    if ((int)uVar14 <= count) {
      uVar14 = count;
    }
    if (iVar5 < (int)uVar14) {
      pdVar6 = (double *)ImGui::MemAlloc((long)(int)uVar14 << 3);
      pdVar2 = (pIVar3->Temp2).Data;
      if (pdVar2 != (double *)0x0) {
        memcpy(pdVar6,pdVar2,(long)(pIVar3->Temp2).Size << 3);
        ImGui::MemFree((pIVar3->Temp2).Data);
      }
      (pIVar3->Temp2).Data = pdVar6;
      (pIVar3->Temp2).Capacity = uVar14;
    }
  }
  dVar15 = (dVar16 - dVar17) / (double)count;
  (pIVar3->Temp2).Size = count;
  if (0 < count) {
    uVar9 = 0;
    do {
      if (((long)(pIVar3->Temp1).Size <= (long)uVar9) ||
         ((pIVar3->Temp1).Data[uVar9] = (double)(int)uVar9 * dVar15 + dVar17 + dVar15 * 0.5,
         (long)(pIVar3->Temp2).Size <= (long)uVar9)) goto LAB_00242912;
      (pIVar3->Temp2).Data[uVar9] = 0.0;
      uVar9 = uVar9 + 1;
    } while ((uint)count != uVar9);
  }
  if (iVar8 < 1) {
    iVar5 = 0;
    local_90 = 0.0;
    dVar17 = 0.0;
  }
  else {
    local_90 = 0.0;
    uVar9 = 0;
    iVar10 = 0;
    iVar5 = 0;
    do {
      dVar18 = (double)(int)*(short *)(label_id + uVar9 * 2);
      if ((dVar18 < dVar17) || (dVar16 < dVar18)) {
        if (dVar18 < dVar17) {
          iVar10 = iVar10 + 1;
        }
      }
      else {
        uVar13 = (uint)((dVar18 - dVar17) / dVar15);
        uVar14 = uVar13;
        if ((int)(count - 1U) <= (int)uVar13) {
          uVar14 = count - 1U;
        }
        uVar12 = 0;
        if (-1 < (int)uVar13) {
          uVar12 = uVar14;
        }
        if (((int)uVar12 < 0) || ((pIVar3->Temp2).Size <= (int)uVar12)) goto LAB_00242912;
        pdVar2 = (pIVar3->Temp2).Data;
        dVar18 = pdVar2[uVar12] + 1.0;
        pdVar2[uVar12] = dVar18;
        if ((pIVar3->Temp2).Size <= (int)uVar12) goto LAB_00242912;
        if (dVar18 <= local_90) {
          dVar18 = local_90;
        }
        iVar5 = iVar5 + 1;
        local_90 = dVar18;
      }
      uVar9 = uVar9 + 1;
    } while (((ulong)values & 0xffffffff) != uVar9);
    dVar17 = (double)iVar10;
  }
  if (((byte)bins & cumulative) == 0) {
    if ((byte)bins == 0) {
      if (cumulative) {
        if (density) {
          iVar5 = iVar8;
        }
        dVar17 = 1.0 / ((double)iVar5 * dVar15);
        if (0 < count) {
          uVar9 = 0;
          do {
            if ((long)(pIVar3->Temp2).Size <= (long)uVar9) goto LAB_00242912;
            pdVar2 = (pIVar3->Temp2).Data;
            pdVar2[uVar9] = pdVar2[uVar9] * dVar17;
            uVar9 = uVar9 + 1;
          } while ((uint)count != uVar9);
        }
        local_90 = local_90 * dVar17;
      }
      goto LAB_002427cc;
    }
    if (density) {
      if ((pIVar3->Temp2).Size < 1) goto LAB_00242912;
      pdVar2 = (pIVar3->Temp2).Data;
      *pdVar2 = dVar17 + *pdVar2;
    }
    if (1 < count) {
      uVar9 = 1;
      do {
        lVar11 = (long)(pIVar3->Temp2).Size;
        if ((lVar11 < (long)uVar9) || (lVar11 <= (long)uVar9)) goto LAB_00242912;
        pdVar2 = (pIVar3->Temp2).Data;
        pdVar2[uVar9] = pdVar2[uVar9 - 1] + pdVar2[uVar9];
        uVar9 = uVar9 + 1;
      } while ((uint)count != uVar9);
    }
  }
  else {
    if (density) {
      if ((pIVar3->Temp2).Size < 1) goto LAB_00242912;
      pdVar2 = (pIVar3->Temp2).Data;
      *pdVar2 = dVar17 + *pdVar2;
    }
    if (1 < count) {
      uVar9 = 1;
      do {
        lVar11 = (long)(pIVar3->Temp2).Size;
        if ((lVar11 < (long)uVar9) || (lVar11 <= (long)uVar9)) goto LAB_00242912;
        pdVar2 = (pIVar3->Temp2).Data;
        pdVar2[uVar9] = pdVar2[uVar9 - 1] + pdVar2[uVar9];
        uVar9 = uVar9 + 1;
      } while ((uint)count != uVar9);
    }
    if (density) {
      iVar5 = iVar8;
    }
    if (0 < count) {
      uVar9 = 0;
      do {
        if ((long)(pIVar3->Temp2).Size <= (long)uVar9) goto LAB_00242912;
        pdVar2 = (pIVar3->Temp2).Data;
        pdVar2[uVar9] = pdVar2[uVar9] * (1.0 / (double)iVar5);
        uVar9 = uVar9 + 1;
      } while ((uint)count != uVar9);
    }
  }
  if ((count < 1) || ((pIVar3->Temp2).Size < count)) {
LAB_00242912:
    __assert_fail("i >= 0 && i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                  ,0x68b,"T &ImVector<double>::operator[](int) [T = double]");
  }
  local_90 = (pIVar3->Temp2).Data[(ulong)(uint)count - 1];
LAB_002427cc:
  local_50.Xs = (pIVar3->Temp1).Data;
  local_50.Ys = (pIVar3->Temp2).Data;
  local_50.Offset = 0;
  local_50.Stride = 8;
  local_50.Count = count;
  PlotBarsEx<ImPlot::GetterXsYs<double>>((char *)this,&local_50,dVar15 * bar_scale);
  return local_90;
}

Assistant:

double PlotHistogram(const char* label_id, const T* values, int count, int bins, bool cumulative, bool density, ImPlotRange range, bool outliers, double bar_scale) {

    if (count <= 0 || bins == 0)
        return 0;

    if (range.Min == 0 && range.Max == 0) {
        T Min, Max;
        ImMinMaxArray(values, count, &Min, &Max);
        range.Min = (double)Min;
        range.Max = (double)Max;
    }

    double width;
    if (bins < 0)
        CalculateBins(values, count, bins, range, bins, width);
    else
        width = range.Size() / bins;

    ImVector<double>& bin_centers = GImPlot->Temp1;
    ImVector<double>& bin_counts  = GImPlot->Temp2;
    bin_centers.resize(bins);
    bin_counts.resize(bins);
    int below = 0;

    for (int b = 0; b < bins; ++b) {
        bin_centers[b] = range.Min + b * width + width * 0.5;
        bin_counts[b] = 0;
    }
    int counted = 0;
    double max_count = 0;
    for (int i = 0; i < count; ++i) {
        double val = (double)values[i];
        if (range.Contains(val)) {
            const int b = ImClamp((int)((val - range.Min) / width), 0, bins - 1);
            bin_counts[b] += 1.0;
            if (bin_counts[b] > max_count)
                max_count = bin_counts[b];
            counted++;
        }
        else if (val < range.Min) {
            below++;
        }
    }
    if (cumulative && density) {
        if (outliers)
            bin_counts[0] += below;
        for (int b = 1; b < bins; ++b)
            bin_counts[b] += bin_counts[b-1];
        double scale = 1.0 / (outliers ? count : counted);
        for (int b = 0; b < bins; ++b)
            bin_counts[b] *= scale;
        max_count = bin_counts[bins-1];
    }
    else if (cumulative) {
        if (outliers)
            bin_counts[0] += below;
        for (int b = 1; b < bins; ++b)
            bin_counts[b] += bin_counts[b-1];
        max_count = bin_counts[bins-1];
    }
    else if (density) {
        double scale = 1.0 / ((outliers ? count : counted) * width);
        for (int b = 0; b < bins; ++b)
            bin_counts[b] *= scale;
        max_count *= scale;
    }
    PlotBars(label_id, &bin_centers.Data[0], &bin_counts.Data[0], bins, bar_scale*width);
    return max_count;
}